

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

void __thiscall soul::heart::Parser::parseStateVariables(Parser *this,ScannedTopLevelItem *item)

{
  pointer pUVar1;
  iterator __begin3;
  pointer pUVar2;
  UTF8Reader local_28;
  
  prepareToRescan(this,item);
  pUVar2 = (item->stateVariableDecls).
           super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
           super__Vector_impl_data._M_start;
  pUVar1 = (item->stateVariableDecls).
           super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pUVar2 != pUVar1) {
    for (; pUVar2 != pUVar1; pUVar2 = pUVar2 + 1) {
      local_28.data = pUVar2->data;
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      resetPosition(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,&local_28);
      parseStateVariable(this);
    }
  }
  (this->module).object = (Module *)0x0;
  return;
}

Assistant:

void parseStateVariables (ScannedTopLevelItem& item)
    {
        prepareToRescan (item);

        if (! item.stateVariableDecls.empty())
        {
            for (auto& g : item.stateVariableDecls)
            {
                resetPosition (g);
                parseStateVariable();
            }
        }

        module.reset();
    }